

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

HTMLElement * __thiscall
choc::html::HTMLElement::setProperty(HTMLElement *this,string *propertyName,string_view value)

{
  undefined1 in_R8B;
  string_view text;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_78,propertyName,"=\"");
  text._M_str = (char *)0x1;
  text._M_len = (size_t)value._M_str;
  escapeHTMLString_abi_cxx11_(&sStack_98,(HTMLElement *)value._M_len,text,(bool)in_R8B);
  std::operator+(&local_58,&local_78,&sStack_98);
  std::operator+(&local_38,&local_58,'\"');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->properties,
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return this;
}

Assistant:

HTMLElement& setProperty (const std::string& propertyName, std::string_view value)
    {
        properties.push_back (propertyName + "=\"" + escapeHTMLString (value, true) + '"');
        return *this;
    }